

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmeans_abstract.h
# Opt level: O1

void __thiscall AbstractKMeans<float>::showClusters(AbstractKMeans<float> *this)

{
  pointer pPVar1;
  ostream *poVar2;
  pointer pCVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (this->K_ != 0) {
    uVar4 = 0;
    do {
      pCVar3 = (this->clusters_).
               super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = *(long *)&pCVar3[uVar4].points_.
                        super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>._M_impl;
      pPVar1 = *(pointer *)
                ((long)&pCVar3[uVar4].points_.
                        super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>._M_impl + 8
                );
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cluster ",8);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   \t",4);
      lVar5 = (long)pPVar1 - lVar5;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 4;
        lVar5 = lVar5 + (ulong)(lVar5 == 0);
        lVar6 = 4;
        do {
          poVar2 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              *(int *)(*(long *)&(this->clusters_).
                                                 super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                                 points_.
                                                 super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>
                                                 ._M_impl + lVar6));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          lVar6 = lVar6 + 0x10;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->K_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Radius : ",9);
  pCVar3 = (this->clusters_).super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->clusters_).super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pCVar3) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>
                         ((double)*(float *)((long)&pCVar3->cluster_id_ + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," \t",2);
      uVar4 = uVar4 + 1;
      pCVar3 = (this->clusters_).
               super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x40;
    } while (uVar4 < (ulong)((long)(this->clusters_).
                                   super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 6));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size : ",7);
  if ((this->clusters_).super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      (this->clusters_).super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," \t",2);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->clusters_).
                                   super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->clusters_).
                                   super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void showClusters() {

        for(int i = 0; i < K_; i++) {

            size_t total_points_cluster =  clusters_[i].getClusterSize();

            cout << "Cluster " << clusters_[i].getID() << "   \t";

            for(int j = 0; j < total_points_cluster; j++) {
                cout << clusters_[i].getPoint(j).getID() << " ";
            }
            cout << endl;

        }
        cout << "\n";
        cout << "Radius : ";

        for (int j = 0; j < clusters_.size(); ++j) {
            Cluster<DataType>& cluster = clusters_[j];
            cout << cluster.getRadius() << " \t";
        }
        cout << endl;

        cout << "Size : ";

        for (int j = 0; j < clusters_.size(); ++j) {
            Cluster<DataType>& cluster = clusters_[j];
            cout << cluster.getClusterSize() << " \t";
        }
        cout << endl;
    }